

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BatchKmersCounter.cc
# Opt level: O3

shared_ptr<KmerList> __thiscall
BatchKmersCounter::kmerCountOMPDiskBased
          (BatchKmersCounter *this,uint8_t K,LongReadsDatastore *reads,uint minCount,string *tmpdir,
          string *workdir,uchar disk_batches)

{
  size_type *psVar1;
  uint64_t *puVar2;
  size_type *psVar3;
  ulong *puVar4;
  ulong *puVar5;
  size_type sVar6;
  KMerNodeFreq_s *pKVar7;
  _func_int *p_Var8;
  undefined8 uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  ostream *poVar13;
  undefined8 *puVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var18;
  ulong uVar19;
  ulong uVar20;
  uint64_t uVar21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  int i;
  ulong uVar22;
  KmerList *this_00;
  pointer pcVar23;
  uint uVar24;
  long lVar25;
  int iVar26;
  ulong uVar27;
  ulong *puVar28;
  size_type *psVar29;
  long lVar30;
  uint uVar31;
  string *psVar32;
  long *plVar33;
  shared_ptr<KmerList> sVar34;
  ulong uStack_b10;
  uint64_t *local_b08;
  uint64_t hist [256];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  ios_base local_210 [264];
  long *local_108;
  shared_ptr<KmerList> kmer_list;
  shared_ptr<KmerList> *kmerlist;
  ulong local_c0;
  size_type *local_b0;
  string __str_1;
  ulong local_88;
  uint local_64;
  size_type *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  
  uVar24 = (uint)disk_batches;
  uStack_b10 = 0x1d321a;
  __str.field_2._8_8_ = reads;
  poVar13 = sdglib::OutputLog(INFO,true);
  uStack_b10 = 0x1d3231;
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"disk-based kmer counting with ",0x1e);
  uStack_b10 = 0x1d323c;
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,uVar24);
  uStack_b10 = 0x1d3253;
  std::__ostream_insert<char,std::char_traits<char>>(poVar13," batches",8);
  uStack_b10 = 0x1d3267;
  std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
  uStack_b10 = 0x1d3272;
  std::ostream::put((char)poVar13);
  uStack_b10 = 0x1d327a;
  std::ostream::flush();
  puVar2 = _VTT;
  uVar22 = (ulong)uVar24;
  uVar27 = 0;
  if (uVar24 != 0) {
    psVar3 = &__str._M_string_length;
    __str_1.field_2._8_8_ = _setbuf;
    uVar16 = 0;
    do {
      psVar29 = &__str_1._M_string_length;
      uVar17 = uVar16 + 1;
      lVar15 = (*(long *)(__str.field_2._8_8_ + 0x18) - *(long *)(__str.field_2._8_8_ + 0x10) >> 4)
               + -1;
      uStack_b10 = 0x1d330c;
      kmerCountOMP((BatchKmersCounter *)&local_108,K,(LongReadsDatastore *)__str.field_2._8_8_,
                   (lVar15 * uVar16) / uVar22,(lVar15 * uVar17) / uVar22,0);
      pcVar23 = (tmpdir->_M_dataplus)._M_p;
      uStack_b10 = 0x1d332d;
      local_60 = psVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,pcVar23,pcVar23 + tmpdir->_M_string_length);
      uStack_b10 = 0x1d333c;
      std::__cxx11::string::append((char *)&local_60);
      uVar24 = 1;
      uVar31 = (uint)uVar16;
      if (9 < uVar16) {
        uVar11 = 4;
        do {
          uVar24 = uVar11;
          uVar10 = (uint)uVar16;
          if (uVar10 < 100) {
            uVar24 = uVar24 - 2;
            goto LAB_001d338f;
          }
          if (uVar10 < 1000) {
            uVar24 = uVar24 - 1;
            goto LAB_001d338f;
          }
          if (uVar10 < 10000) goto LAB_001d338f;
          uVar16 = (uVar16 & 0xffffffff) / 10000;
          uVar11 = uVar24 + 4;
        } while (99999 < uVar10);
        uVar24 = uVar24 + 1;
      }
LAB_001d338f:
      uStack_b10 = 0x1d33aa;
      local_b0 = psVar29;
      std::__cxx11::string::_M_construct((ulong)&local_b0,(char)uVar24);
      uStack_b10 = 0x1d33bc;
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b0,uVar24,uVar31);
      pcVar23 = (pointer)0xf;
      if (local_60 != psVar3) {
        pcVar23 = (pointer)__str._M_string_length;
      }
      if (pcVar23 < __str_1._M_dataplus._M_p + __str._M_dataplus._M_p) {
        pcVar23 = (pointer)0xf;
        if (local_b0 != psVar29) {
          pcVar23 = (pointer)__str_1._M_string_length;
        }
        if (pcVar23 < __str_1._M_dataplus._M_p + __str._M_dataplus._M_p) goto LAB_001d33ff;
        uStack_b10 = 0x1d341a;
        puVar14 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_60);
      }
      else {
LAB_001d33ff:
        uStack_b10 = 0x1d3408;
        puVar14 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_b0);
      }
      hist[0xff] = (uint64_t)&__str_2._M_string_length;
      psVar1 = puVar14 + 2;
      if ((size_type *)*puVar14 == psVar1) {
        __str_2._M_string_length = *psVar1;
        __str_2.field_2._M_allocated_capacity = puVar14[3];
      }
      else {
        __str_2._M_string_length = *psVar1;
        hist[0xff] = (uint64_t)*puVar14;
      }
      __str_2._M_dataplus._M_p = (pointer)puVar14[1];
      *puVar14 = psVar1;
      puVar14[1] = 0;
      *(undefined1 *)psVar1 = 0;
      uStack_b10 = 0x1d3484;
      std::ofstream::ofstream(&local_b08,(string *)(hist + 0xff),_S_trunc|_S_out|_S_bin);
      if ((size_type *)hist[0xff] != &__str_2._M_string_length) {
        uStack_b10 = 0x1d34a6;
        operator_delete((void *)hist[0xff],__str_2._M_string_length + 1);
      }
      if (local_b0 != psVar29) {
        uStack_b10 = 0x1d34c1;
        operator_delete(local_b0,__str_1._M_string_length + 1);
      }
      if (local_60 != psVar3) {
        uStack_b10 = 0x1d34d9;
        operator_delete(local_60,__str._M_string_length + 1);
      }
      uStack_b10 = 0x1d34fe;
      std::ostream::write((char *)&local_b08,*local_108);
      uStack_b10 = 0x1d350a;
      std::ofstream::close();
      uStack_b10 = 0x1d3516;
      poVar13 = sdglib::OutputLog(INFO,true);
      uStack_b10 = 0x1d352d;
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"batch ",6);
      uStack_b10 = 0x1d3538;
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,uVar31);
      uStack_b10 = 0x1d354f;
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," done and dumped with ",0x16);
      uStack_b10 = 0x1d355b;
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
      uStack_b10 = 0x1d3572;
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," kmers",6);
      uStack_b10 = 0x1d3586;
      std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
      uStack_b10 = 0x1d3591;
      std::ostream::put((char)poVar13);
      uStack_b10 = 0x1d3599;
      std::ostream::flush();
      local_b08 = puVar2;
      *(undefined8 *)((long)hist + (puVar2[-3] - 8)) = __str_1.field_2._8_8_;
      uStack_b10 = 0x1d35c6;
      std::filebuf::~filebuf((filebuf *)hist);
      uStack_b10 = 0x1d35d2;
      std::ios_base::~ios_base((ios_base *)(hist + 0x1e));
      if (kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        uStack_b10 = 0x1d35e3;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      uVar27 = uVar22;
      uVar16 = uVar17;
    } while (uVar17 != uVar22);
  }
  uStack_b10 = 0x1d360f;
  poVar13 = sdglib::OutputLog(INFO,true);
  uStack_b10 = 0x1d3626;
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"merging from disk",0x11);
  uStack_b10 = 0x1d363a;
  std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
  uStack_b10 = 0x1d3645;
  std::ostream::put((char)poVar13);
  uStack_b10 = 0x1d364d;
  std::ostream::flush();
  iVar26 = (int)uVar27;
  lVar15 = -(ulong)(iVar26 * 0x208 + 0xfU & 0xfffffff0);
  lVar25 = (long)hist + lVar15 + -8;
  __str.field_2._8_8_ = lVar25;
  if (disk_batches == '\0') {
    lVar25 = lVar25 - (ulong)(iVar26 + 0xfU & 0xfffffff0);
    puVar28 = (ulong *)(lVar25 - (ulong)(iVar26 * 0x11 + 0xfU & 0xfffffff0));
  }
  else {
    lVar30 = 0;
    do {
      *(undefined8 *)((long)&uStack_b10 + lVar15) = 0x1d3692;
      std::ifstream::ifstream((void *)(lVar25 + lVar30));
      lVar30 = lVar30 + 0x208;
    } while ((ulong)(uint)(iVar26 << 9) + uVar27 * 8 != lVar30);
    lVar25 = lVar25 - (ulong)(iVar26 + 0xfU & 0xfffffff0);
    puVar28 = (ulong *)(lVar25 - (ulong)(iVar26 * 0x11 + 0xfU & 0xfffffff0));
    if (disk_batches != '\0') {
      uVar16 = 0;
      do {
        hist[0xff] = (uint64_t)&__str_2._M_string_length;
        pcVar23 = (tmpdir->_M_dataplus)._M_p;
        sVar6 = tmpdir->_M_string_length;
        puVar28[-1] = 0x1d3708;
        std::__cxx11::string::_M_construct<char*>((string *)(hist + 0xff),pcVar23,pcVar23 + sVar6);
        puVar28[-1] = 0x1d3717;
        std::__cxx11::string::append((char *)(hist + 0xff));
        uVar24 = 1;
        if (9 < uVar16) {
          uVar31 = 4;
          uVar17 = uVar16;
          do {
            uVar24 = uVar31;
            uVar11 = (uint)uVar17;
            if (uVar11 < 100) {
              uVar24 = uVar24 - 2;
              goto LAB_001d3769;
            }
            if (uVar11 < 1000) {
              uVar24 = uVar24 - 1;
              goto LAB_001d3769;
            }
            if (uVar11 < 10000) goto LAB_001d3769;
            uVar17 = (uVar17 & 0xffffffff) / 10000;
            uVar31 = uVar24 + 4;
          } while (99999 < uVar11);
          uVar24 = uVar24 + 1;
        }
LAB_001d3769:
        local_60 = &__str._M_string_length;
        puVar28[-1] = 0x1d3782;
        std::__cxx11::string::_M_construct((ulong)&local_60,(char)uVar24);
        psVar3 = local_60;
        puVar28[-1] = 0x1d3790;
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)psVar3,uVar24,(uint)uVar16);
        psVar3 = local_60;
        uVar21 = hist[0xff];
        pcVar23 = (pointer)0xf;
        if ((size_type *)hist[0xff] != &__str_2._M_string_length) {
          pcVar23 = (pointer)__str_2._M_string_length;
        }
        if (pcVar23 < __str._M_dataplus._M_p + __str_2._M_dataplus._M_p) {
          pcVar23 = (pointer)0xf;
          if (local_60 != &__str._M_string_length) {
            pcVar23 = (pointer)__str._M_string_length;
          }
          if (pcVar23 < __str._M_dataplus._M_p + __str_2._M_dataplus._M_p) goto LAB_001d37e1;
          puVar28[-1] = 0x1d37fc;
          puVar14 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,uVar21);
        }
        else {
LAB_001d37e1:
          puVar28[-1] = 0x1d37ed;
          puVar14 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)(hist + 0xff),(ulong)psVar3);
        }
        puVar2 = puVar14 + 2;
        if ((uint64_t *)*puVar14 == puVar2) {
          hist[1] = *puVar2;
          hist[2] = puVar14[3];
          local_b08 = hist + 1;
        }
        else {
          hist[1] = *puVar2;
          local_b08 = (uint64_t *)*puVar14;
        }
        hist[0] = puVar14[1];
        *puVar14 = puVar2;
        psVar32 = (string *)(uVar16 * 0x208 + __str.field_2._8_8_);
        puVar14[1] = 0;
        *(undefined1 *)puVar2 = 0;
        puVar28[-1] = 0x1d386b;
        std::ifstream::open(psVar32,(_Ios_Openmode)&local_b08);
        puVar2 = local_b08;
        if (local_b08 != hist + 1) {
          uVar17 = hist[1] + 1;
          puVar28[-1] = 0x1d3886;
          operator_delete(puVar2,uVar17);
        }
        psVar3 = local_60;
        if (local_60 != &__str._M_string_length) {
          uVar17 = __str._M_string_length + 1;
          puVar28[-1] = 0x1d389f;
          operator_delete(psVar3,uVar17);
        }
        uVar21 = hist[0xff];
        if ((size_type *)hist[0xff] != &__str_2._M_string_length) {
          uVar17 = __str_2._M_string_length + 1;
          puVar28[-1] = 0x1d38c1;
          operator_delete((void *)uVar21,uVar17);
        }
        puVar28[-1] = 0x1d38db;
        std::istream::read((char *)psVar32,uVar16 * 0x11 + (long)puVar28);
        *(undefined1 *)(lVar25 + uVar16) = 1;
        uVar16 = uVar16 + 1;
      } while (uVar16 != uVar22);
      uVar16 = 0;
      if (disk_batches != '\x01') {
        uVar20 = 1;
        uVar17 = uVar16;
        puVar5 = puVar28;
        do {
          uVar16 = uVar17;
          if ((*(char *)(lVar25 + uVar20) == '\x01') &&
             (puVar4 = (ulong *)((long)puVar28 + uVar17 * 0x11 + 8), uVar16 = uVar20 & 0xffffffff,
             *puVar4 <= *(ulong *)((long)puVar5 + 0x19) &&
             (ulong)(*(ulong *)((long)puVar5 + 0x11) < *(ulong *)((long)puVar28 + uVar17 * 0x11)) <=
             *(ulong *)((long)puVar5 + 0x19) - *puVar4)) {
            uVar16 = uVar17;
          }
          uVar20 = uVar20 + 1;
          uVar17 = uVar16;
          puVar5 = (ulong *)((long)puVar5 + 0x11);
        } while (uVar27 != uVar20);
      }
      goto LAB_001d3972;
    }
  }
  uVar16 = 0;
LAB_001d3972:
  __str_1.field_2._8_8_ = *(undefined8 *)((long)puVar28 + uVar16 * 0x11);
  local_c0 = *(ulong *)((long)puVar28 + uVar16 * 0x11 + 8);
  puVar28[-1] = 0x1d39a7;
  memset(&local_b08,0,0x800);
  puVar28[-1] = 0x1d39b1;
  puVar14 = (undefined8 *)operator_new(0x20);
  this_00 = (KmerList *)(puVar14 + 2);
  uVar24 = 0;
  puVar14[1] = 0x100000001;
  *puVar14 = &PTR___Sp_counted_ptr_inplace_00255c98;
  puVar14[2] = 0;
  puVar14[3] = 0;
  *(undefined8 **)(this + 8) = puVar14;
  *(KmerList **)this = this_00;
  if (disk_batches == '\0') {
    uVar21 = 1;
    uVar16 = 0;
    local_88 = 0;
  }
  else {
    kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)puVar28 + 0x11);
    local_88 = 0;
    uVar16 = 0;
    do {
      uVar17 = 0xffffffff;
      do {
        uVar17 = (ulong)((int)uVar17 + 1);
      } while (*(char *)(lVar25 + uVar17) != '\x01');
      if (disk_batches != '\x01') {
        uVar20 = 1;
        _Var18._M_pi = kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
        do {
          if (*(char *)(lVar25 + uVar20) == '\x01') {
            puVar5 = (ulong *)((long)puVar28 + uVar17 * 0x11 + 8);
            uVar31 = (uint)uVar20;
            if (*puVar5 <= *(ulong *)&(_Var18._M_pi)->_M_use_count &&
                (ulong)((_Var18._M_pi)->_vptr__Sp_counted_base <
                       *(_func_int ***)((long)puVar28 + uVar17 * 0x11)) <=
                *(ulong *)&(_Var18._M_pi)->_M_use_count - *puVar5) {
              uVar31 = (uint)uVar17;
            }
            uVar17 = (ulong)uVar31;
          }
          uVar20 = uVar20 + 1;
          _Var18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)&_Var18._M_pi[1]._vptr__Sp_counted_base + 1);
        } while (uVar27 != uVar20);
      }
      lVar15 = uVar17 * 0x11;
      puVar5 = (ulong *)(lVar15 + (long)puVar28);
      uVar20 = *(ulong *)((long)puVar28 + lVar15);
      uVar19 = *(ulong *)((long)puVar28 + lVar15 + 8);
      local_64 = (uint)(uVar16 & 0xff);
      if (local_c0 < uVar19 || local_c0 - uVar19 < (ulong)((ulong)__str_1.field_2._8_8_ < uVar20)) {
        hist[(uVar16 & 0xff) - 1] = hist[(uVar16 & 0xff) - 1] + 1;
        if (minCount <= local_64) {
          uVar20 = puVar14[3];
          if (uVar20 <= local_88) {
            puVar28[-1] = 0x1d3b02;
            KmerList::resize(this_00,uVar20 + 10000000);
          }
          pKVar7 = this_00->kmers;
          *(ulong *)((long)&pKVar7[local_88].kdata + 8) = local_c0;
          *(undefined8 *)&pKVar7[local_88].kdata = __str_1.field_2._8_8_;
          pKVar7[local_88].count = (uint8_t)uVar16;
          local_88 = local_88 + 1;
          uVar20 = *puVar5;
          uVar19 = puVar5[1];
        }
        local_64 = (uint)(byte)puVar5[2];
        local_c0 = uVar19;
        __str_1.field_2._8_8_ = uVar20;
      }
      else {
        local_64 = (byte)puVar5[2] + local_64;
        if (0xfe < local_64) {
          local_64 = 0xff;
        }
      }
      plVar33 = (long *)(uVar17 * 0x208 + __str.field_2._8_8_);
      puVar28[-1] = 0x1d3b78;
      std::istream::read((char *)plVar33,(long)puVar5);
      if ((*(byte *)((long)plVar33 + *(long *)(*plVar33 + -0x18) + 0x20) & 2) != 0) {
        *(undefined1 *)(lVar25 + uVar17) = 0;
        uVar24 = uVar24 + 1;
      }
      uVar16 = (ulong)local_64;
    } while (uVar24 < disk_batches);
    uVar21 = hist[(uVar16 & 0xff) - 1] + 1;
  }
  hist[(uVar16 & 0xff) - 1] = uVar21;
  if (minCount <= (uint)(uVar16 & 0xff)) {
    uVar17 = puVar14[3];
    if (uVar17 <= local_88) {
      puVar28[-1] = 0x1d3c1e;
      KmerList::resize(this_00,uVar17 + 10000000);
    }
    pKVar7 = this_00->kmers;
    *(ulong *)((long)&pKVar7[local_88].kdata + 8) = local_c0;
    *(undefined8 *)&pKVar7[local_88].kdata = __str_1.field_2._8_8_;
    pKVar7[local_88].count = (uint8_t)uVar16;
    local_88 = local_88 + 1;
  }
  puVar28[-1] = 0x1d3c59;
  KmerList::resize(this_00,local_88);
  if (disk_batches != '\0') {
    uVar16 = 0;
    do {
      puVar28[-1] = 0x1d3c8a;
      std::ifstream::close();
      local_60 = &__str._M_string_length;
      pcVar23 = (tmpdir->_M_dataplus)._M_p;
      sVar6 = tmpdir->_M_string_length;
      puVar28[-1] = 0x1d3cab;
      std::__cxx11::string::_M_construct<char*>((string *)&local_60,pcVar23,pcVar23 + sVar6);
      puVar28[-1] = 0x1d3cba;
      std::__cxx11::string::append((char *)&local_60);
      uVar24 = 1;
      if (9 < uVar16) {
        uVar31 = 4;
        uVar17 = uVar16;
        do {
          uVar24 = uVar31;
          uVar11 = (uint)uVar17;
          if (uVar11 < 100) {
            uVar24 = uVar24 - 2;
            goto LAB_001d3d07;
          }
          if (uVar11 < 1000) {
            uVar24 = uVar24 - 1;
            goto LAB_001d3d07;
          }
          if (uVar11 < 10000) goto LAB_001d3d07;
          uVar17 = (uVar17 & 0xffffffff) / 10000;
          uVar31 = uVar24 + 4;
        } while (99999 < uVar11);
        uVar24 = uVar24 + 1;
      }
LAB_001d3d07:
      local_b0 = &__str_1._M_string_length;
      puVar28[-1] = 0x1d3d29;
      std::__cxx11::string::_M_construct((ulong)&local_b0,(char)uVar24);
      psVar3 = local_b0;
      puVar28[-1] = 0x1d3d3a;
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)psVar3,uVar24,(uint)uVar16);
      psVar29 = local_60;
      psVar3 = local_b0;
      pcVar23 = (pointer)0xf;
      if (local_60 != &__str._M_string_length) {
        pcVar23 = (pointer)__str._M_string_length;
      }
      if (pcVar23 < __str_1._M_dataplus._M_p + __str._M_dataplus._M_p) {
        pcVar23 = (pointer)0xf;
        if (local_b0 != &__str_1._M_string_length) {
          pcVar23 = (pointer)__str_1._M_string_length;
        }
        if (pcVar23 < __str_1._M_dataplus._M_p + __str._M_dataplus._M_p) goto LAB_001d3d88;
        puVar28[-1] = 0x1d3da2;
        puVar14 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)psVar29);
      }
      else {
LAB_001d3d88:
        puVar28[-1] = 0x1d3d90;
        puVar14 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_60,(ulong)psVar3);
      }
      psVar3 = puVar14 + 2;
      if ((size_type *)*puVar14 == psVar3) {
        __str_2._M_string_length = *psVar3;
        __str_2.field_2._M_allocated_capacity = puVar14[3];
        hist[0xff] = (uint64_t)&__str_2._M_string_length;
      }
      else {
        __str_2._M_string_length = *psVar3;
        hist[0xff] = (uint64_t)*puVar14;
      }
      uVar21 = hist[0xff];
      __str_2._M_dataplus._M_p = (pointer)puVar14[1];
      *puVar14 = psVar3;
      puVar14[1] = 0;
      *(undefined1 *)psVar3 = 0;
      puVar28[-1] = 0x1d3dfb;
      remove((char *)uVar21);
      uVar21 = hist[0xff];
      if ((size_type *)hist[0xff] != &__str_2._M_string_length) {
        uVar17 = __str_2._M_string_length + 1;
        puVar28[-1] = 0x1d3e16;
        operator_delete((void *)uVar21,uVar17);
      }
      psVar3 = local_b0;
      if (local_b0 != &__str_1._M_string_length) {
        uVar17 = __str_1._M_string_length + 1;
        puVar28[-1] = 0x1d3e38;
        operator_delete(psVar3,uVar17);
      }
      psVar3 = local_60;
      if (local_60 != &__str._M_string_length) {
        uVar17 = __str._M_string_length + 1;
        puVar28[-1] = 0x1d3e51;
        operator_delete(psVar3,uVar17);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar22);
  }
  puVar28[-1] = 0x1d3e6d;
  poVar13 = sdglib::OutputLog(INFO,true);
  puVar28[-1] = 0x1d3e7c;
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
  puVar28[-1] = 0x1d3e93;
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"/",1);
  puVar28[-1] = 0x1d3ea5;
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
  puVar28[-1] = 0x1d3ebc;
  std::__ostream_insert<char,std::char_traits<char>>(poVar13," kmers with Freq >= ",0x14);
  puVar28[-1] = 0x1d3ec7;
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
  p_Var8 = poVar13->_vptr_basic_ostream[-3];
  puVar28[-1] = 0x1d3ede;
  std::ios::widen((char)p_Var8 + (char)poVar13);
  puVar28[-1] = 0x1d3ee9;
  std::ostream::put((char)poVar13);
  puVar28[-1] = 0x1d3ef1;
  std::ostream::flush();
  puVar28[-1] = 0x1d3f07;
  iVar12 = std::__cxx11::string::compare((char *)workdir);
  uVar9 = __str.field_2._8_8_;
  _Var18._M_pi = extraout_RDX;
  if (iVar12 != 0) {
    pcVar23 = (workdir->_M_dataplus)._M_p;
    sVar6 = workdir->_M_string_length;
    local_60 = &__str._M_string_length;
    puVar28[-1] = 0x1d3f2e;
    std::__cxx11::string::_M_construct<char*>((string *)&local_60,pcVar23,pcVar23 + sVar6);
    puVar28[-1] = 0x1d3f3e;
    std::__cxx11::string::append((char *)&local_60);
    puVar28[-1] = 0x1d3f53;
    std::ofstream::ofstream(hist + 0xff,(string *)&local_60,_S_out);
    psVar3 = local_60;
    if (local_60 != &__str._M_string_length) {
      puVar28[-1] = 0x1d3f68;
      operator_delete(psVar3,__str._M_string_length + 1);
    }
    lVar15 = 1;
    do {
      puVar28[-1] = 0x1d3f85;
      poVar13 = (ostream *)std::ostream::operator<<(hist + 0xff,(int)lVar15);
      puVar28[-1] = 0x1d3f98;
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,", ",2);
      puVar28[-1] = 0x1d3fa8;
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
      p_Var8 = poVar13->_vptr_basic_ostream[-3];
      puVar28[-1] = 0x1d3fbf;
      std::ios::widen((char)p_Var8 + (char)poVar13);
      puVar28[-1] = 0x1d3fca;
      std::ostream::put((char)poVar13);
      puVar28[-1] = 0x1d3fd2;
      std::ostream::flush();
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0x100);
    puVar28[-1] = 0x1d3fea;
    std::ofstream::close();
    hist[0xff] = (uint64_t)_VTT;
    *(undefined8 *)((long)hist + _VTT[-3] + 0x7f8) = _setbuf;
    puVar28[-1] = 0x1d4014;
    std::filebuf::~filebuf((filebuf *)&__str_2);
    puVar28[-1] = 0x1d4020;
    std::ios_base::~ios_base(local_210);
    _Var18._M_pi = extraout_RDX_00;
  }
  if (disk_batches != '\0') {
    lVar15 = (ulong)(uint)(iVar26 << 9) + uVar27 * 8;
    do {
      puVar28[-1] = 0x1d4043;
      std::ifstream::~ifstream((void *)(lVar15 + uVar9 + -0x208));
      lVar15 = lVar15 + -0x208;
      _Var18._M_pi = extraout_RDX_01;
    } while (lVar15 != 0);
  }
  sVar34.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var18._M_pi;
  sVar34.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<KmerList>)sVar34.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<KmerList>
BatchKmersCounter::kmerCountOMPDiskBased(uint8_t K, LongReadsDatastore const &reads,
                                         unsigned minCount, std::string tmpdir, std::string workdir,
                                         unsigned char disk_batches) {

    //If size larger than batch (or still not enough cpus used, or whatever), Lauch 2 tasks to sort the 2 halves, with minFreq=0

    sdglib::OutputLog() << "disk-based kmer counting with "<<(int) disk_batches<<" batches"<<std::endl;
    uint64_t total_kmers_in_batches=0;
    for (auto batch=0;batch < disk_batches;batch++) {
        uint64_t to = (batch+1) * reads.size()/disk_batches;
        uint64_t from= batch * reads.size()/disk_batches;
        auto kmer_list = kmerCountOMP(K, reads,from,to);
        std::ofstream batch_file(tmpdir+"/kmer_count_batch_"+std::to_string((int)batch),std::ios::out | std::ios::trunc | std::ios::binary);
        batch_file.write((const char *)kmer_list->kmers,sizeof(KMerNodeFreq_s)*kmer_list->size);
        batch_file.close();
        sdglib::OutputLog() << "batch "<<(int) batch<<" done and dumped with "<<kmer_list->size<< " kmers" <<std::endl;
        total_kmers_in_batches+=kmer_list->size;
    }

    //now a multi-merge sort between all batch files into the Dict
    sdglib::OutputLog() << "merging from disk"<<std::endl;
    //open all batch files
    std::ifstream dbf[disk_batches];
    bool dbf_active[disk_batches];
    KMerNodeFreq_s next_knf_from_dbf[disk_batches];
    uint finished_files=0;
    for (auto i=0;i<disk_batches;i++){
        dbf[i].open(tmpdir+"/kmer_count_batch_"+std::to_string((int)i),std::ios::in | std::ios::binary);
        dbf[i].read((char *)&next_knf_from_dbf[i],sizeof(KMerNodeFreq_s));
        dbf_active[i]=true;
    }
    //set all finished flags to false
    //TODO: stupid minimum search
    KMerNodeFreq_s current_kmer;
    //while finished_files<batches
    bool first=true;
    uint min=0;
    for (auto i=1;i<disk_batches;++i)
        if (dbf_active[i]){
            if (next_knf_from_dbf[i]<next_knf_from_dbf[min]) min=i;
        }
    current_kmer=next_knf_from_dbf[min];
    current_kmer.count=0;
    uint64_t used = 0,not_used=0;
    uint64_t hist[256];
    for (auto &h:hist) h=0;
    std::shared_ptr<KmerList> kmerlist=std::make_shared<KmerList>();
    //size_t last_kmer=0;
    size_t alloc_block=10000000;
    while (finished_files<disk_batches) {
        //find minimum of the non-finished files
        uint min=0;
        while (!dbf_active[min])++min;
        for (auto i=1;i<disk_batches;++i)
            if (dbf_active[i]){
                if (next_knf_from_dbf[i]<next_knf_from_dbf[min]) min=i;
            }
        //larger than current kmer?
        if (next_knf_from_dbf[min] > current_kmer) {
            ++hist[std::min(255,(int)current_kmer.count)];
            if (current_kmer.count>=minCount) {
                //(*dict)->insertEntryNoLocking(BRQ_Entry((BRQ_Kmer) current_kmer, current_kmer.kc));
                //kmerlist.push_back(current_kmer);
                if (used>=kmerlist->size) kmerlist->resize(kmerlist->size+alloc_block);
                kmerlist->kmers[used]=current_kmer;
                ++used;
            }
            else ++not_used;
            current_kmer=next_knf_from_dbf[min];
        } else {
            current_kmer.combine(next_knf_from_dbf[min]);
        }
        //advance min file
        dbf[min].read((char *)&next_knf_from_dbf[min],sizeof(KMerNodeFreq_s));
        if ( dbf[min].eof() ) {
            dbf_active[min]=false;
            ++finished_files;
        }
    }

    ++hist[(int)current_kmer.count];
    if (current_kmer.count>=minCount) {
        //kmerlist.push_back(current_kmer);
        if (used>=kmerlist->size) kmerlist->resize(kmerlist->size+alloc_block);
        kmerlist->kmers[used]=current_kmer;
        used++;
    }
    else not_used++;
    kmerlist->resize(used);
    for (auto i=0;i<disk_batches;i++) {
        dbf[i].close();
        std::remove((tmpdir + "/kmer_count_batch_" +std::to_string((int)i)).c_str());
    }
    sdglib::OutputLog()<< used << "/" << used+not_used << " kmers with Freq >= " << minCount << std::endl;
    if (""!=workdir) {
        std::ofstream kff(workdir + "/small_K.freqs");
        for (auto i = 1; i < 256; i++) kff << i << ", " << hist[i] << std::endl;
        kff.close();
    }
    return kmerlist;
}